

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_sseq.c
# Opt level: O1

uint32 * mk_sseq(uint16 *seg,uint32 n_frame,acmod_id_t *phone,uint32 n_phone,model_def_t *mdef)

{
  uint32 *puVar1;
  uint uVar2;
  ulong uVar3;
  model_def_entry_t *pmVar4;
  ushort uVar5;
  
  puVar1 = (uint32 *)
           __ckd_calloc__((ulong)n_frame,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_sseq.c"
                          ,0x45);
  if (n_frame != 0) {
    uVar2 = 0xffffffff;
    uVar3 = 0;
    pmVar4 = (model_def_entry_t *)0x0;
    do {
      uVar5 = seg[uVar3];
      if ((short)uVar5 < 0) {
        uVar2 = uVar2 + 1;
        if (n_phone <= uVar2) {
          __assert_fail("p < n_phone",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_sseq.c"
                        ,0x52,
                        "uint32 *mk_sseq(uint16 *, uint32, acmod_id_t *, uint32, model_def_t *)");
        }
        pmVar4 = mdef->defn + phone[uVar2];
        uVar5 = uVar5 & 0x7fff;
      }
      puVar1[uVar3] = pmVar4->state[(uint)uVar5 % 0x13];
      uVar3 = uVar3 + 1;
    } while (n_frame != uVar3);
  }
  return puVar1;
}

Assistant:

uint32 *
mk_sseq(uint16 *seg,
	uint32 n_frame,
	acmod_id_t *phone,
	uint32 n_phone,
	model_def_t *mdef)
{
    uint32 *sseq;
    uint32 f;
    uint32 p;
    model_def_entry_t *defn = NULL;
    uint32 s;
    uint32 n_state = MAX_N_STATE-1;	/* BEWARE: this should not stay */
    uint16 seg_val;

    sseq = ckd_calloc(n_frame, sizeof(uint32));

    p = 0;
    --p;

    for (f = 0; f < n_frame; f++) {
	seg_val = seg[f];

	if (seg_val & 0x8000) {
	    /* reached a phone begin marker */

	    ++p;	/* next phone */

	    assert(p < n_phone);

	    defn = &mdef->defn[phone[p]];

	    seg_val &= 0x7fff;	/* clr phone begin bit */
	}

	s = seg_val % n_state;	/* model state [0..N-1] where N is # of states/model */

	sseq[f] = defn->state[s];
    }

    return sseq;
}